

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveMemoryInit.cpp
# Opt level: O0

void __thiscall wasm::RemoveMemoryInit::run(RemoveMemoryInit *this,Module *module)

{
  bool bVar1;
  Name local_70;
  size_t local_60;
  char *local_58;
  anon_class_1_0_00000001 local_39;
  function<bool_(wasm::DataSegment_*)> local_38;
  Module *local_18;
  Module *module_local;
  RemoveMemoryInit *this_local;
  
  local_18 = module;
  module_local = (Module *)this;
  std::function<bool(wasm::DataSegment*)>::
  function<wasm::RemoveMemoryInit::run(wasm::Module*)::_lambda(wasm::DataSegment*)_1_,void>
            ((function<bool(wasm::DataSegment*)> *)&local_38,&local_39);
  Module::removeDataSegments(module,&local_38);
  std::function<bool_(wasm::DataSegment_*)>::~function(&local_38);
  bVar1 = IString::operator_cast_to_bool(&(local_18->start).super_IString);
  if (bVar1) {
    local_60 = (local_18->start).super_IString.str._M_len;
    local_58 = (local_18->start).super_IString.str._M_str;
    Module::removeFunction(local_18,(Name)(local_18->start).super_IString.str);
    wasm::Name::Name(&local_70);
    wasm::Name::operator=(&local_18->start,&local_70);
  }
  return;
}

Assistant:

void run(Module* module) override {
    module->removeDataSegments([&](DataSegment* curr) { return true; });
    if (module->start) {
      module->removeFunction(module->start);
      module->start = Name();
    }
  }